

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSON __thiscall anon_unknown.dwarf_400cc::JSONParser::parse(JSONParser *this)

{
  char *pcVar1;
  string *val;
  value_type_e vVar2;
  Reactor *pRVar3;
  pointer pSVar4;
  pointer pSVar5;
  element_type *peVar6;
  JSONParser *pJVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  byte *pbVar11;
  long lVar12;
  pointer pSVar13;
  pointer pSVar14;
  pointer pSVar15;
  long lVar16;
  logic_error *plVar17;
  runtime_error *prVar18;
  uint uVar19;
  ulong uVar20;
  _Tp_alloc_type *p_Var21;
  lex_state_e lVar22;
  long lVar23;
  uint *extraout_RDX;
  uint *__s;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_03;
  code *pcVar24;
  JSON *pJVar25;
  JSONParser *in_RSI;
  QUtil *this_00;
  undefined1 *puVar26;
  string *utf8;
  undefined *puVar27;
  long __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  parser_state_e pVar28;
  QUtil *pQVar29;
  JSON JVar30;
  lex_state_e lStack_140;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  JSON item;
  element_type local_b8;
  vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  *local_a0;
  JSON tos;
  string local_80;
  qpdf_offset_t *local_60;
  JSONParser *local_58;
  JSON local_50;
  JSON local_40;
  
  __lhs = &in_RSI->token;
  pcVar1 = in_RSI->buf;
  local_60 = &in_RSI->u_count;
  local_a0 = &in_RSI->stack;
  val = &in_RSI->dict_key;
  local_d0 = __lhs;
  local_58 = this;
LAB_0011fbbc:
  if (in_RSI->done != false) {
    if (in_RSI->parser_state == ps_done) {
      pJVar25 = &(in_RSI->stack).
                 super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].item;
      if ((in_RSI->reactor != (Reactor *)0x0) &&
         ((peVar6 = (pJVar25->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr, peVar6 == (element_type *)0x0 ||
          (1 < *(int *)((long)(peVar6->value)._M_t.
                              super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>
                              ._M_t + 8) - 1U)))) {
        (*in_RSI->reactor->_vptr_Reactor[5])();
      }
      pJVar7 = local_58;
      std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)local_58,
                 (__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)pJVar25);
      JVar30.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX_03._M_pi;
      JVar30.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pJVar7;
      return (JSON)JVar30.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
    }
    plVar17 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar17,"JSON: premature end of input");
    puVar27 = &std::runtime_error::typeinfo;
    pcVar24 = std::runtime_error::~runtime_error;
LAB_00120be1:
    __cxa_throw(plVar17,puVar27,pcVar24);
  }
  (in_RSI->token)._M_string_length = 0;
  *(in_RSI->token)._M_dataplus._M_p = '\0';
  pQVar29 = (QUtil *)0x0;
  lVar16 = 0;
LAB_0011fbe2:
  while( true ) {
    pbVar11 = (byte *)in_RSI->p;
    if (pbVar11 == (byte *)(pcVar1 + in_RSI->bytes)) {
      in_RSI->p = pcVar1;
      iVar10 = (*in_RSI->is->_vptr_InputSource[7])(in_RSI->is,pcVar1,0x4000);
      in_RSI->bytes = CONCAT44(extraout_var,iVar10);
      if (CONCAT44(extraout_var,iVar10) == 0) {
        in_RSI->done = true;
        lVar22 = in_RSI->lex_state;
        goto LAB_00120116;
      }
      pbVar11 = (byte *)in_RSI->p;
    }
    bVar8 = *pbVar11;
    uVar19 = (uint)bVar8;
    if (0x1f < bVar8) break;
    if ((0xd < uVar19) || ((0x2600U >> (uVar19 & 0x1f) & 1) == 0)) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_110,in_RSI->offset);
      std::operator+(&local_130,"JSON: control or null character at offset ",&local_110);
      std::runtime_error::runtime_error(prVar18,(string *)&local_130);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar22 = in_RSI->lex_state;
LAB_0011fc45:
    if (lVar22 != ls_top) goto LAB_00120116;
LAB_0011fc4d:
    in_RSI->p = (char *)(pbVar11 + 1);
    in_RSI->offset = in_RSI->offset + 1;
  }
  lVar22 = in_RSI->lex_state;
  if (bVar8 == 0x20) {
    if (lVar22 == ls_string) goto LAB_0011fd2e;
    goto LAB_0011fc45;
  }
  if (bVar8 == 0x7d) {
    if (lVar22 == ls_string) goto LAB_0011fd2e;
    lStack_140 = ls_end_dict;
    goto LAB_001200f5;
  }
  if (bVar8 == 0x3a) {
    if (lVar22 == ls_string) goto LAB_0011fd2e;
    lStack_140 = ls_colon;
    goto LAB_001200f5;
  }
  if (bVar8 == 0x5b) {
    if (lVar22 == ls_string) goto LAB_0011fd2e;
    if (lVar22 != ls_top) goto LAB_00120116;
    lVar16 = in_RSI->offset;
    in_RSI->token_start = lVar16;
    in_RSI->lex_state = ls_begin_array;
LAB_001200d9:
    in_RSI->p = (char *)(pbVar11 + 1);
    in_RSI->offset = lVar16 + 1;
    goto LAB_0012015c;
  }
  if (bVar8 == 0x5d) {
    if (lVar22 == ls_string) goto LAB_0011fd2e;
    lStack_140 = ls_end_array;
    goto LAB_001200f5;
  }
  if (bVar8 == 0x7b) {
    if (lVar22 == ls_string) goto LAB_0011fd2e;
    if (lVar22 == ls_top) {
      lVar16 = in_RSI->offset;
      in_RSI->token_start = lVar16;
      in_RSI->lex_state = ls_begin_dict;
      goto LAB_001200d9;
    }
    goto LAB_00120116;
  }
  if (bVar8 != 0x2c) {
    switch(lVar22) {
    case ls_top:
      in_RSI->token_start = in_RSI->offset;
      bVar8 = *pbVar11;
      if (bVar8 == 0x22) {
        in_RSI->lex_state = ls_string;
        in_RSI->p = (char *)(pbVar11 + 1);
        in_RSI->offset = in_RSI->offset + 1;
      }
      else if ((byte)(bVar8 + 0x9f) < 0x1a) {
        append(in_RSI,ls_alpha);
      }
      else if (bVar8 == 0x2d) {
        append(in_RSI,ls_number_minus);
      }
      else {
        if (8 < (byte)(bVar8 - 0x31)) {
          if (bVar8 == 0x30) goto LAB_0011ff0d;
          goto LAB_00121119;
        }
LAB_0011fe7f:
        append(in_RSI,ls_number_before_point);
      }
      goto LAB_0011fbe2;
    case ls_number:
      if (9 < (byte)(bVar8 - 0x30)) goto LAB_00121111;
      break;
    case ls_number_minus:
      if ((byte)(bVar8 - 0x31) < 9) goto LAB_0011fe7f;
      if (uVar19 != 0x30) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_f0,in_RSI->offset);
        std::operator+(&local_110,"JSON: offset ",&local_f0);
        std::operator+(&local_130,&local_110,": numeric literal: no digit after minus sign");
        std::runtime_error::runtime_error(prVar18,(string *)&local_130);
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_0011ff0d:
      append(in_RSI,ls_number_leading_zero);
      goto LAB_0011fbe2;
    case ls_number_leading_zero:
      if ((uVar19 == 0x65) || (uVar19 == 0x45)) {
LAB_0011fef4:
        append(in_RSI,ls_number_e);
      }
      else {
        if (uVar19 != 0x2e) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_f0,in_RSI->offset);
          std::operator+(&local_110,"JSON: offset ",&local_f0);
          std::operator+(&local_130,&local_110,": number with leading zero");
          std::runtime_error::runtime_error(prVar18,(string *)&local_130);
          __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
LAB_0011febd:
        append(in_RSI,ls_number_point);
      }
      goto LAB_0011fbe2;
    case ls_number_before_point:
      if (9 < (byte)(bVar8 - 0x30)) {
        if ((uVar19 == 0x65) || (uVar19 == 0x45)) goto LAB_0011fef4;
        if (uVar19 == 0x2e) goto LAB_0011febd;
        goto LAB_00121111;
      }
      break;
    case ls_number_point:
      if (9 < (byte)(bVar8 - 0x30)) goto LAB_00121111;
      append(in_RSI,ls_number_after_point);
      goto LAB_0011fbe2;
    case ls_number_after_point:
      if (9 < (byte)(bVar8 - 0x30)) {
        if ((uVar19 | 0x20) == 0x65) goto LAB_0011fef4;
        goto LAB_00121111;
      }
      break;
    case ls_number_e:
      if ((byte)(bVar8 - 0x30) < 10) goto LAB_0011fe9a;
      if ((uVar19 != 0x2d) && (uVar19 != 0x2b)) goto LAB_00121111;
      append(in_RSI,ls_number_e_sign);
      goto LAB_0011fbe2;
    case ls_number_e_sign:
      if (9 < (byte)(bVar8 - 0x30)) goto LAB_00121111;
LAB_0011fe9a:
      append(in_RSI,ls_number);
      goto LAB_0011fbe2;
    case ls_alpha:
      if (0x19 < (byte)(bVar8 + 0x9f)) goto LAB_00121111;
      break;
    case ls_string:
      if (bVar8 == 0x5c) {
        in_RSI->lex_state = ls_backslash;
        goto LAB_0011fc4d;
      }
      if (bVar8 != 0x22) break;
      lStack_140 = ls_after_string;
      if (lVar16 != 0) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_f0,lVar16);
        std::operator+(&local_110,"JSON: offset ",&local_f0);
        std::operator+(&local_130,&local_110,": UTF-16 high surrogate not followed by low surrogate"
                      );
        std::runtime_error::runtime_error(prVar18,(string *)&local_130);
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001200fa;
    default:
      plVar17 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar17,"JSONParser::getToken : trying to handle delimiter state");
      goto LAB_00120bd3;
    case ls_backslash:
      in_RSI->lex_state = ls_string;
      bVar8 = *pbVar11;
      switch(bVar8) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_0011ff6d_caseD_6f:
        in_RSI->lex_state = ls_backslash;
        goto LAB_00121111;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
        in_RSI->lex_state = ls_u4;
        *local_60 = 0;
        local_60[1] = 0;
        goto LAB_0012007a;
      default:
        if ((((bVar8 != 0x22) && (bVar8 != 0x2f)) && (bVar8 != 0x66)) &&
           ((bVar8 != 0x62 && (bVar8 != 0x5c)))) goto switchD_0011ff6d_caseD_6f;
      }
      std::__cxx11::string::push_back((char)__lhs);
LAB_0012007a:
      in_RSI->p = in_RSI->p + 1;
      in_RSI->offset = in_RSI->offset + 1;
      goto LAB_0011fbe2;
    case ls_u4:
      bVar8 = ::qpdf::util::hex_decode_char(bVar8);
      if (bVar8 < 0x10) goto code_r0x0011fda0;
      goto LAB_00121111;
    }
LAB_0011fd2e:
    append(in_RSI);
    goto LAB_0011fbe2;
  }
  if (lVar22 == ls_string) goto LAB_0011fd2e;
  lStack_140 = ls_comma;
LAB_001200f5:
  if (lVar22 == ls_top) {
LAB_001200fa:
    in_RSI->lex_state = lStack_140;
    in_RSI->p = (char *)(pbVar11 + 1);
    in_RSI->offset = in_RSI->offset + 1;
    goto LAB_0012015c;
  }
LAB_00120116:
  if ((in_RSI->token)._M_string_length == 0) goto LAB_00120140;
  if (ls_alpha < lVar22) {
LAB_00121111:
    tokenError(in_RSI);
LAB_00121119:
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_80,in_RSI->offset);
    std::operator+(&local_f0,"JSON: offset ",&local_80);
    std::operator+(&local_110,&local_f0,": unexpected character ");
    item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&item,in_RSI->p,in_RSI->p + 1);
    std::operator+(&local_130,&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item);
    std::runtime_error::runtime_error(prVar18,(string *)&local_130);
    __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((0x58U >> (lVar22 & (ls_begin_dict|ls_end_array)) & 1) != 0) {
    in_RSI->lex_state = ls_number;
    goto LAB_0012015c;
  }
  if ((0x202U >> (lVar22 & (ls_begin_dict|ls_end_array)) & 1) == 0) {
    if (lVar22 != ls_top) goto LAB_00121111;
    plVar17 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar17,"tok_start set in ls_top while parsing");
LAB_00120bd3:
    puVar27 = &std::logic_error::typeinfo;
    pcVar24 = std::logic_error::~logic_error;
    goto LAB_00120be1;
  }
LAB_0012015c:
  if (in_RSI->parser_state == ps_done) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_80,in_RSI->offset);
    std::operator+(&local_f0,"JSON: offset ",&local_80);
    std::operator+(&local_110,&local_f0,": material follows end of object: ");
    std::operator+(&local_130,&local_110,local_d0);
    std::runtime_error::runtime_error(prVar18,(string *)&local_130);
    __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((anonymous_namespace)::JSONParser::handleToken()::null_item == '\0') &&
     (iVar10 = __cxa_guard_acquire(&(anonymous_namespace)::JSONParser::handleToken()::null_item),
     iVar10 != 0)) {
    JSON::makeNull();
    __cxa_atexit(JSON::~JSON,(anonymous_namespace)::JSONParser::handleToken()::null_item,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::JSONParser::handleToken()::null_item);
    __lhs = local_d0;
  }
  utf8 = &local_130;
  item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pSVar13 = (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar26 = (undefined1 *)&pSVar13[-1].item;
  if ((in_RSI->stack).
      super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
      ._M_impl.super__Vector_impl_data._M_start == pSVar13) {
    puVar26 = (anonymous_namespace)::JSONParser::handleToken()::null_item;
  }
  std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&tos,
             (__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)puVar26);
  lVar22 = in_RSI->lex_state;
  in_RSI->lex_state = ls_top;
  switch(lVar22) {
  case ls_number:
    JSON::makeNumber(utf8);
    break;
  default:
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_f0,in_RSI->offset);
    std::operator+(&local_110,"JSON: offset ",&local_f0);
    std::operator+(&local_130,&local_110,": premature end of input");
    std::runtime_error::runtime_error(prVar18,(string *)&local_130);
    __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ls_alpha:
    bVar9 = std::operator==(__lhs,"true");
    if (bVar9) {
      JSON::makeBool(false);
    }
    else {
      bVar9 = std::operator==(__lhs,"false");
      if (bVar9) {
        JSON::makeBool(false);
      }
      else {
        bVar9 = std::operator==(__lhs,"null");
        if (!bVar9) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_80,in_RSI->offset);
          std::operator+(&local_f0,"JSON: offset ",&local_80);
          std::operator+(&local_110,&local_f0,": invalid keyword ");
          std::operator+(&local_130,&local_110,local_d0);
          std::runtime_error::runtime_error(prVar18,(string *)&local_130);
          __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        JSON::makeNull();
      }
    }
    break;
  case ls_after_string:
    if ((in_RSI->parser_state | ps_dict_after_item) == ps_dict_after_comma) {
      std::__cxx11::string::_M_assign((string *)val);
      in_RSI->dict_key_offset = in_RSI->token_start;
      in_RSI->parser_state = ps_dict_after_key;
      __lhs = local_d0;
      goto LAB_0012076f;
    }
    JSON::makeString(utf8);
    break;
  case ls_begin_array:
    JSON::makeArray();
    break;
  case ls_end_array:
    if ((in_RSI->parser_state & ~ps_dict_begin) != ps_array_begin) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_f0,in_RSI->offset);
      std::operator+(&local_110,"JSON: offset ",&local_f0);
      std::operator+(&local_130,&local_110,": unexpected array end delimiter");
      std::runtime_error::runtime_error(prVar18,(string *)&local_130);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar28 = (in_RSI->stack).
             super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].state;
    in_RSI->parser_state = pVar28;
    if (tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->end =
           in_RSI->offset;
    }
    pRVar3 = in_RSI->reactor;
    if (pRVar3 != (Reactor *)0x0) {
      (*pRVar3->_vptr_Reactor[4])(pRVar3,&tos);
LAB_00120356:
      pVar28 = in_RSI->parser_state;
    }
    goto LAB_0012035d;
  case ls_begin_dict:
    JSON::makeDictionary();
    break;
  case ls_end_dict:
    if ((in_RSI->parser_state != ps_dict_begin) && (in_RSI->parser_state != ps_dict_after_item)) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_f0,in_RSI->offset);
      std::operator+(&local_110,"JSON: offset ",&local_f0);
      std::operator+(&local_130,&local_110,": unexpected dictionary end delimiter");
      std::runtime_error::runtime_error(prVar18,(string *)&local_130);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar28 = (in_RSI->stack).
             super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].state;
    in_RSI->parser_state = pVar28;
    if (tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->end =
           in_RSI->offset;
    }
    pRVar3 = in_RSI->reactor;
    if (pRVar3 != (Reactor *)0x0) {
      (*pRVar3->_vptr_Reactor[4])(pRVar3,&tos);
      goto LAB_00120356;
    }
LAB_0012035d:
    __lhs = local_d0;
    if (pVar28 != ps_done) {
      std::
      vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
      ::pop_back(local_a0);
    }
    goto LAB_0012076f;
  case ls_colon:
    if (in_RSI->parser_state != ps_dict_after_key) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_f0,in_RSI->offset);
      std::operator+(&local_110,"JSON: offset ",&local_f0);
      std::operator+(&local_130,&local_110,": unexpected colon");
      std::runtime_error::runtime_error(prVar18,(string *)&local_130);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    in_RSI->parser_state = ps_dict_after_colon;
    goto LAB_0012076f;
  case ls_comma:
    pVar28 = ps_dict_after_comma;
    if (in_RSI->parser_state != ps_dict_after_item) {
      if (in_RSI->parser_state != ps_array_after_item) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_f0,in_RSI->offset);
        std::operator+(&local_110,"JSON: offset ",&local_f0);
        std::operator+(&local_130,&local_110,": unexpected comma");
        std::runtime_error::runtime_error(prVar18,(string *)&local_130);
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVar28 = ps_array_after_comma;
    }
    in_RSI->parser_state = pVar28;
    goto LAB_0012076f;
  }
  std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&item,
             (__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)utf8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length);
  if (item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->start =
         in_RSI->token_start;
    (item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->end =
         in_RSI->offset;
  }
  pVar28 = in_RSI->parser_state;
  __s = extraout_RDX;
  if ((ulong)pVar28 < 10) {
    __s = &switchD_0012041e::switchdataD_0020c7a8;
    p_Var21 = (_Tp_alloc_type *)
              ((long)&switchD_0012041e::switchdataD_0020c7a8 +
              (long)(int)(&switchD_0012041e::switchdataD_0020c7a8)[pVar28]);
    switch(pVar28) {
    case ps_top:
      if (item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
LAB_0012053e:
        pSVar15 = (in_RSI->stack).
                  super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar15 ==
            (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_b8.end = std::
                         vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                         ::_M_check_len(local_a0,(size_type)utf8,
                                        (char *)&switchD_0012041e::switchdataD_0020c7a8);
          pSVar4 = (in_RSI->stack).
                   super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar5 = (in_RSI->stack).
                   super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pSVar13 = std::
                    _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                    ::_M_allocate((_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                                   *)local_b8.end,(size_t)utf8);
          *(undefined4 *)((long)pSVar13 + ((long)pSVar15 - (long)pSVar4)) = 9;
          std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)pSVar13 + ((long)pSVar15 - (long)pSVar4) + 8),
                     (__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&item);
          pSVar14 = std::
                    vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                    ::_S_relocate(pSVar4,pSVar15,pSVar13,p_Var21);
          pSVar15 = std::
                    vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                    ::_S_relocate(pSVar15,pSVar5,pSVar14 + 1,p_Var21);
          lVar16 = (long)(in_RSI->stack).
                         super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar4;
          std::
          _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
          ::_M_deallocate((_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                           *)pSVar4,(pointer)(lVar16 / 0x18),lVar16 % 0x18);
          (in_RSI->stack).
          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
          ._M_impl.super__Vector_impl_data._M_start = pSVar13;
          (in_RSI->stack).
          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar13 + local_b8.end;
        }
        else {
          pSVar15->state = ps_done;
          std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&pSVar15->item,
                     (__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&item);
          pSVar15 = (in_RSI->stack).
                    super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        (in_RSI->stack).
        super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar15;
        in_RSI->parser_state = ps_done;
        __lhs = local_d0;
        goto LAB_0012076f;
      }
      p_Var21 = (_Tp_alloc_type *)0x9;
      pVar28 = ps_done;
      if (1 < (((item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value
               )._M_t.
               super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t.
               super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
               super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl)->type_code -
              vt_dictionary) goto LAB_0012053e;
      goto LAB_001204c7;
    default:
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_f0,in_RSI->offset);
      std::operator+(&local_110,"JSON: offset ",&local_f0);
      std::operator+(&local_130,&local_110,": expect string as dictionary key");
      std::runtime_error::runtime_error(prVar18,(string *)&local_130);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case ps_dict_after_key:
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_f0,in_RSI->offset);
      std::operator+(&local_110,"JSON: offset ",&local_f0);
      std::operator+(&local_130,&local_110,": expected \':\'");
      std::runtime_error::runtime_error(prVar18,(string *)&local_130);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case ps_dict_after_colon:
      pRVar3 = in_RSI->reactor;
      if (pRVar3 != (Reactor *)0x0) {
        utf8 = val;
        iVar10 = (*pRVar3->_vptr_Reactor[6])(pRVar3,val,&item);
        pVar28 = ps_dict_after_item;
        __s = extraout_RDX_01;
        if ((char)iVar10 != '\0') goto LAB_001204c7;
      }
      utf8 = (string *)&tos;
      JSON::addDictionaryMember(&local_40,utf8,(JSON *)val);
      pJVar25 = &local_40;
      pVar28 = ps_dict_after_item;
      break;
    case ps_dict_after_item:
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_f0,in_RSI->offset);
      std::operator+(&local_110,"JSON: offset ",&local_f0);
      std::operator+(&local_130,&local_110,": expected \',\' or \'}\'");
      std::runtime_error::runtime_error(prVar18,(string *)&local_130);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case ps_array_begin:
    case ps_array_after_comma:
      if (in_RSI->reactor != (Reactor *)0x0) {
        utf8 = (string *)&item;
        iVar10 = (*in_RSI->reactor->_vptr_Reactor[7])();
        pVar28 = ps_array_after_item;
        __s = extraout_RDX_00;
        if ((char)iVar10 != '\0') goto LAB_001204c7;
      }
      utf8 = (string *)&tos;
      JSON::addArrayElement(&local_50,(JSON *)utf8);
      pJVar25 = &local_50;
      pVar28 = ps_array_after_item;
      break;
    case ps_array_after_item:
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_f0,in_RSI->offset);
      std::operator+(&local_110,"JSON: offset ",&local_f0);
      std::operator+(&local_130,&local_110,": expected \',\' or \']\'");
      std::runtime_error::runtime_error(prVar18,(string *)&local_130);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case ps_done:
      plVar17 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar17,"JSONParser::handleToken: unexpected parser state");
      __cxa_throw(plVar17,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pJVar25->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __s = extraout_RDX_02;
LAB_001204c7:
    in_RSI->parser_state = pVar28;
    __lhs = local_d0;
  }
  if ((item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     (1 < (((item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value).
           _M_t.super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t
           .super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
           super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl)->type_code - vt_dictionary
     )) goto LAB_0012076f;
  pSVar15 = (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar15 ==
      (in_RSI->stack).
      super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_b8.end = std::
                   vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                   ::_M_check_len(local_a0,(size_type)utf8,(char *)__s);
    pSVar4 = (in_RSI->stack).
             super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (in_RSI->stack).
             super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar13 = std::
              _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ::_M_allocate((_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                             *)local_b8.end,(size_t)utf8);
    p_Var21 = (_Tp_alloc_type *)(ulong)in_RSI->parser_state;
    *(parser_state_e *)((long)pSVar13 + ((long)pSVar15 - (long)pSVar4)) = in_RSI->parser_state;
    std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)pSVar13 + ((long)pSVar15 - (long)pSVar4) + 8),
               (__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&item);
    pSVar14 = std::
              vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ::_S_relocate(pSVar4,pSVar15,pSVar13,p_Var21);
    pSVar15 = std::
              vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ::_S_relocate(pSVar15,pSVar5,pSVar14 + 1,p_Var21);
    lVar16 = (long)(in_RSI->stack).
                   super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar4;
    std::
    _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
    ::_M_deallocate((_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                     *)pSVar4,(pointer)(lVar16 / 0x18),lVar16 % 0x18);
    (in_RSI->stack).
    super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar13;
    (in_RSI->stack).
    super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar13 + local_b8.end;
  }
  else {
    pSVar15->state = pVar28;
    std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&pSVar15->item,
               (__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&item);
    pSVar15 = (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  (in_RSI->stack).
  super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar15;
  if (item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    vVar2 = (((item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value).
             _M_t.super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>.
             _M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
             .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl)->type_code;
    if (vVar2 == vt_array) {
      pVar28 = ps_array_begin;
      if (in_RSI->reactor != (Reactor *)0x0) {
        (*in_RSI->reactor->_vptr_Reactor[3])();
        pVar28 = ps_array_begin;
      }
    }
    else {
      if (vVar2 != vt_dictionary) goto LAB_00120681;
      pVar28 = ps_dict_begin;
      if (in_RSI->reactor != (Reactor *)0x0) {
        (*in_RSI->reactor->_vptr_Reactor[2])();
        pVar28 = ps_dict_begin;
      }
    }
    in_RSI->parser_state = pVar28;
    pSVar15 = (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_00120681:
  __lhs = local_d0;
  if (500 < (ulong)(((long)pSVar15 -
                    (long)(local_a0->
                          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_f0,in_RSI->offset);
    std::operator+(&local_110,"JSON: offset ",&local_f0);
    std::operator+(&local_130,&local_110,": maximum object depth exceeded");
    std::runtime_error::runtime_error(prVar18,(string *)&local_130);
    __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0012076f:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tos.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  goto LAB_0011fbbc;
code_r0x0011fda0:
  uVar20 = in_RSI->u_value << 4;
  this_00 = (QUtil *)(bVar8 | uVar20);
  in_RSI->u_value = (unsigned_long)this_00;
  lVar23 = in_RSI->u_count + 1;
  in_RSI->u_count = lVar23;
  lVar12 = in_RSI->offset;
  __val = lVar16;
  if (lVar23 == 4) {
    __val = lVar12 + -5;
    uVar19 = (uint)uVar20 & 0xfc00;
    if ((short)uVar19 == -0x2400) {
      if (lVar16 != lVar12 + -0xb) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_f0,__val);
        std::operator+(&local_110,"JSON: offset ",&local_f0);
        std::operator+(&local_130,&local_110,
                       ": UTF-16 low surrogate found not immediately after high surrogate");
        std::runtime_error::runtime_error(prVar18,(string *)&local_130);
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      QUtil::toUTF8_abi_cxx11_
                (&local_130,
                 (QUtil *)((ulong)((uint)this_00 & 0x3ff) + (ulong)(((uint)pQVar29 & 0x3ff) << 10) +
                          0x10000),4);
      std::__cxx11::string::append((string *)__lhs);
      std::__cxx11::string::~string((string *)&local_130);
      __val = 0;
      this_00 = pQVar29;
    }
    else if (uVar19 == 0xd800) {
      if (lVar16 != 0) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_80,__val);
        std::operator+(&local_f0,"JSON: offset ",&local_80);
        std::operator+(&local_110,&local_f0,
                       ": UTF-16 high surrogate found after previous high surrogate at offset ");
        std::__cxx11::to_string((string *)&item,lVar16);
        std::operator+(&local_130,&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item);
        std::runtime_error::runtime_error(prVar18,(string *)&local_130);
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      QUtil::toUTF8_abi_cxx11_(&local_130,this_00,4);
      std::__cxx11::string::append((string *)__lhs);
      std::__cxx11::string::~string((string *)&local_130);
      __val = lVar16;
      this_00 = pQVar29;
    }
    in_RSI->lex_state = ls_string;
    lVar12 = in_RSI->offset;
    pQVar29 = this_00;
  }
  in_RSI->p = in_RSI->p + 1;
  in_RSI->offset = lVar12 + 1;
  lVar16 = __val;
  goto LAB_0011fbe2;
LAB_00120140:
  if (lVar22 == ls_top) goto LAB_0011fbbc;
  goto LAB_0012015c;
}

Assistant:

JSON
JSONParser::parse()
{
    while (!done) {
        getToken();
        handleToken();
    }
    if (parser_state != ps_done) {
        QTC::TC("libtests", "JSON parse premature EOF");
        throw std::runtime_error("JSON: premature end of input");
    }
    auto const& tos = stack.back().item;
    if (reactor && !(tos.isArray() || tos.isDictionary())) {
        reactor->topLevelScalar();
    }
    return tos;
}